

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BasicBlock.cc
# Opt level: O2

int __thiscall flow::BasicBlock::remove(BasicBlock *this,char *__filename)

{
  unique_ptr<flow::Instr,_std::default_delete<flow::Instr>_> *puVar1;
  pointer ppVVar2;
  Instr *pIVar3;
  BasicBlock *successor;
  long lVar4;
  Instr *in_RDX;
  long lVar5;
  pointer ppVVar6;
  const_iterator __position;
  
  pIVar3 = &getTerminator((BasicBlock *)__filename)->super_Instr;
  if (pIVar3 == in_RDX) {
    ppVVar2 = *(pointer *)
               ((long)&(in_RDX->operands_).
                       super__Vector_base<flow::Value_*,_std::allocator<flow::Value_*>_>._M_impl + 8
               );
    for (ppVVar6 = (in_RDX->operands_).
                   super__Vector_base<flow::Value_*,_std::allocator<flow::Value_*>_>._M_impl.
                   super__Vector_impl_data._M_start; ppVVar6 != ppVVar2; ppVVar6 = ppVVar6 + 1) {
      if ((*ppVVar6 != (Value *)0x0) &&
         (successor = (BasicBlock *)__dynamic_cast(*ppVVar6,&Value::typeinfo,&typeinfo,0),
         successor != (BasicBlock *)0x0)) {
        unlinkSuccessor((BasicBlock *)__filename,successor);
      }
    }
  }
  __position._M_current =
       *(unique_ptr<flow::Instr,_std::default_delete<flow::Instr>_> **)(__filename + 0x50);
  puVar1 = *(unique_ptr<flow::Instr,_std::default_delete<flow::Instr>_> **)(__filename + 0x58);
  lVar4 = (long)puVar1 - (long)__position._M_current;
  for (lVar5 = lVar4 >> 5; 0 < lVar5; lVar5 = lVar5 + -1) {
    if (((__position._M_current)->_M_t).
        super___uniq_ptr_impl<flow::Instr,_std::default_delete<flow::Instr>_>._M_t.
        super__Tuple_impl<0UL,_flow::Instr_*,_std::default_delete<flow::Instr>_>.
        super__Head_base<0UL,_flow::Instr_*,_false>._M_head_impl == in_RDX) goto LAB_00134bac;
    if (__position._M_current[1]._M_t.
        super___uniq_ptr_impl<flow::Instr,_std::default_delete<flow::Instr>_>._M_t.
        super__Tuple_impl<0UL,_flow::Instr_*,_std::default_delete<flow::Instr>_>.
        super__Head_base<0UL,_flow::Instr_*,_false>._M_head_impl == in_RDX) {
      __position._M_current = __position._M_current + 1;
      goto LAB_00134bac;
    }
    if (__position._M_current[2]._M_t.
        super___uniq_ptr_impl<flow::Instr,_std::default_delete<flow::Instr>_>._M_t.
        super__Tuple_impl<0UL,_flow::Instr_*,_std::default_delete<flow::Instr>_>.
        super__Head_base<0UL,_flow::Instr_*,_false>._M_head_impl == in_RDX) {
      __position._M_current = __position._M_current + 2;
      goto LAB_00134bac;
    }
    if (__position._M_current[3]._M_t.
        super___uniq_ptr_impl<flow::Instr,_std::default_delete<flow::Instr>_>._M_t.
        super__Tuple_impl<0UL,_flow::Instr_*,_std::default_delete<flow::Instr>_>.
        super__Head_base<0UL,_flow::Instr_*,_false>._M_head_impl == in_RDX) {
      __position._M_current = __position._M_current + 3;
      goto LAB_00134bac;
    }
    __position._M_current = __position._M_current + 4;
    lVar4 = lVar4 + -0x20;
  }
  lVar4 = lVar4 >> 3;
  if (lVar4 == 1) {
LAB_00134b93:
    if (((__position._M_current)->_M_t).
        super___uniq_ptr_impl<flow::Instr,_std::default_delete<flow::Instr>_>._M_t.
        super__Tuple_impl<0UL,_flow::Instr_*,_std::default_delete<flow::Instr>_>.
        super__Head_base<0UL,_flow::Instr_*,_false>._M_head_impl != in_RDX) {
      __position._M_current = puVar1;
    }
  }
  else if (lVar4 == 2) {
LAB_00134b8a:
    if (((__position._M_current)->_M_t).
        super___uniq_ptr_impl<flow::Instr,_std::default_delete<flow::Instr>_>._M_t.
        super__Tuple_impl<0UL,_flow::Instr_*,_std::default_delete<flow::Instr>_>.
        super__Head_base<0UL,_flow::Instr_*,_false>._M_head_impl != in_RDX) {
      __position._M_current = __position._M_current + 1;
      goto LAB_00134b93;
    }
  }
  else {
    if (lVar4 != 3) goto LAB_00134bd7;
    if (((__position._M_current)->_M_t).
        super___uniq_ptr_impl<flow::Instr,_std::default_delete<flow::Instr>_>._M_t.
        super__Tuple_impl<0UL,_flow::Instr_*,_std::default_delete<flow::Instr>_>.
        super__Head_base<0UL,_flow::Instr_*,_false>._M_head_impl != in_RDX) {
      __position._M_current = __position._M_current + 1;
      goto LAB_00134b8a;
    }
  }
LAB_00134bac:
  if (__position._M_current != puVar1) {
    (this->super_Value)._vptr_Value =
         (_func_int **)
         ((__position._M_current)->_M_t).
         super___uniq_ptr_impl<flow::Instr,_std::default_delete<flow::Instr>_>._M_t.
         super__Tuple_impl<0UL,_flow::Instr_*,_std::default_delete<flow::Instr>_>.
         super__Head_base<0UL,_flow::Instr_*,_false>._M_head_impl;
    ((__position._M_current)->_M_t).
    super___uniq_ptr_impl<flow::Instr,_std::default_delete<flow::Instr>_>._M_t.
    super__Tuple_impl<0UL,_flow::Instr_*,_std::default_delete<flow::Instr>_>.
    super__Head_base<0UL,_flow::Instr_*,_false>._M_head_impl = (Instr *)0x0;
    std::
    vector<std::unique_ptr<flow::Instr,_std::default_delete<flow::Instr>_>,_std::allocator<std::unique_ptr<flow::Instr,_std::default_delete<flow::Instr>_>_>_>
    ::erase((vector<std::unique_ptr<flow::Instr,_std::default_delete<flow::Instr>_>,_std::allocator<std::unique_ptr<flow::Instr,_std::default_delete<flow::Instr>_>_>_>
             *)(__filename + 0x50),__position);
    in_RDX->basicBlock_ = (BasicBlock *)0x0;
    return (int)this;
  }
LAB_00134bd7:
  __assert_fail("i != code_.end()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/christianparpart[P]flow/src/flow/ir/BasicBlock.cc"
                ,0x4c,"std::unique_ptr<Instr> flow::BasicBlock::remove(Instr *)");
}

Assistant:

std::unique_ptr<Instr> BasicBlock::remove(Instr* instr) {
  // if we're removing the terminator instruction
  if (instr == getTerminator()) {
    // then unlink all successors also
    for (Value* operand : instr->operands()) {
      if (auto bb = dynamic_cast<BasicBlock*>(operand)) {
        unlinkSuccessor(bb);
      }
    }
  }

  auto i = std::find_if(
      code_.begin(), code_.end(),
      [&](const auto& obj) { return obj.get() == instr; });
  assert(i != code_.end());

  std::unique_ptr<Instr> removedInstr = std::move(*i);
  code_.erase(i);
  instr->setParent(nullptr);
  return removedInstr;
}